

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Clara::Help::Help(Help *this,bool *showHelpFlag)

{
  pointer p_Var1;
  Opt *pOVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  StringRef optName;
  StringRef optName_00;
  StringRef optName_01;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3054:18)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3054:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_50;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  p_Var1 = (pointer)operator_new(0x20);
  local_50._M_alloc = &__a2;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a66d0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__BoundRef_001a6720;
  *(bool **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = showHelpFlag;
  local_50._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3054:18)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3054:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_50);
  local_40 = 0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3054:18)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3054:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>
        *)&p_Var1->_M_impl;
  local_50._M_ptr = p_Var1;
  Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl
            ((ParserRefImpl<Catch::Clara::Opt> *)this,
             (shared_ptr<Catch::Clara::Detail::BoundRef> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
  (this->super_Opt).m_optNames.
  super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Opt).m_optNames.
  super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Opt).m_optNames.
  super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.
  super_ComposableParserImpl<Catch::Clara::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_001a7308;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start =
       "display usage information";
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0x19;
  optName.m_size = 2;
  optName.m_start = "-?";
  pOVar2 = Opt::operator[](&this->super_Opt,optName);
  optName_00.m_size = 2;
  optName_00.m_start = "-h";
  pOVar2 = Opt::operator[](pOVar2,optName_00);
  optName_01.m_size = 6;
  optName_01.m_start = "--help";
  pOVar2 = Opt::operator[](pOVar2,optName_01);
  (pOVar2->super_ParserRefImpl<Catch::Clara::Opt>).m_optionality = Optional;
  return;
}

Assistant:

Help::Help( bool& showHelpFlag ):
            Opt( [&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            } ) {
            static_cast<Opt&> ( *this )(
                "display usage information" )["-?"]["-h"]["--help"]
                .optional();
        }